

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O3

void __thiscall
Diligent::ShaderResourceCacheVk::Resource::SetUniformBuffer
          (Resource *this,RefCntAutoPtr<Diligent::IDeviceObject> *_pBuffer,Uint64 _BaseOffset,
          Uint64 _RangeSize)

{
  BufferVkImpl *pBVar1;
  Uint64 UVar2;
  char (*Args_1) [58];
  string msg;
  string local_48;
  
  Args_1 = (char (*) [58])_RangeSize;
  if (1 < (byte)(this->Type - UniformBuffer)) {
    FormatString<char[26],char[86]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Type == DescriptorType::UniformBuffer || Type == DescriptorType::UniformBufferDynamic"
               ,(char (*) [86])_RangeSize);
    Args_1 = (char (*) [58])0xcd;
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetUniformBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0xcd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  RefCntAutoPtr<Diligent::IDeviceObject>::operator=(&this->pObject,_pBuffer);
  pBVar1 = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::BufferVkImpl>(&this->pObject);
  if (pBVar1 == (BufferVkImpl *)0x0) {
    UVar2 = 0;
  }
  else {
    if (((pBVar1->super_BufferBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
         .m_Desc.BindFlags & BIND_UNIFORM_BUFFER) == BIND_NONE) {
      FormatString<char[26],char[58]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"(pBuffVk->GetDesc().BindFlags & BIND_UNIFORM_BUFFER) != 0",Args_1);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"SetUniformBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0xd8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->Type != UniformBufferDynamic) &&
       ((pBVar1->super_BufferBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
        .m_Desc.Usage == USAGE_DYNAMIC)) {
      FormatString<char[65]>
                (&local_48,
                 (char (*) [65])"Dynamic buffer must be used with UniformBufferDynamic descriptor");
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"SetUniformBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0xda);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    UVar2 = (pBVar1->super_BufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            .m_Desc.Size;
  }
  if (UVar2 < _RangeSize + _BaseOffset) {
    FormatString<char[40]>(&local_48,(char (*) [40])"Specified range is out of buffer bounds");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetUniformBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0xde);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  this->BufferBaseOffset = _BaseOffset;
  this->BufferRangeSize = _RangeSize;
  if (_RangeSize == 0) {
    if (pBVar1 == (BufferVkImpl *)0x0) {
      UVar2 = 0;
    }
    else {
      UVar2 = (pBVar1->super_BufferBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              .m_Desc.Size - _BaseOffset;
    }
    this->BufferRangeSize = UVar2;
  }
  this->BufferDynamicOffset = 0;
  return;
}

Assistant:

void ShaderResourceCacheVk::Resource::SetUniformBuffer(RefCntAutoPtr<IDeviceObject>&& _pBuffer, Uint64 _BaseOffset, Uint64 _RangeSize)
{
    VERIFY_EXPR(Type == DescriptorType::UniformBuffer ||
                Type == DescriptorType::UniformBufferDynamic);

    pObject = std::move(_pBuffer);

    const BufferVkImpl* pBuffVk = pObject.ConstPtr<BufferVkImpl>();

#ifdef DILIGENT_DEBUG
    if (pBuffVk != nullptr)
    {
        // VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER or VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC descriptor type require
        // buffer to be created with VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT
        VERIFY_EXPR((pBuffVk->GetDesc().BindFlags & BIND_UNIFORM_BUFFER) != 0);
        VERIFY(Type == DescriptorType::UniformBufferDynamic || pBuffVk->GetDesc().Usage != USAGE_DYNAMIC,
               "Dynamic buffer must be used with UniformBufferDynamic descriptor");
    }
#endif

    VERIFY(_BaseOffset + _RangeSize <= (pBuffVk != nullptr ? pBuffVk->GetDesc().Size : 0), "Specified range is out of buffer bounds");
    BufferBaseOffset = _BaseOffset;
    BufferRangeSize  = _RangeSize;
    if (BufferRangeSize == 0)
        BufferRangeSize = pBuffVk != nullptr ? (pBuffVk->GetDesc().Size - BufferBaseOffset) : 0;

    // Reset dynamic offset
    BufferDynamicOffset = 0;
}